

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

DdNode * Abc_ConvertSopToBdd(DdManager *dd,char *pSop,DdNode **pbVars)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  bool bVar4;
  DdNode *local_88;
  DdNode *local_80;
  DdNode *local_70;
  int local_54;
  int local_50;
  int v;
  int Value;
  int nVars;
  char *pCube;
  DdNode *bVar;
  DdNode *bTemp;
  DdNode *bCube;
  DdNode *bSum;
  DdNode **pbVars_local;
  char *pSop_local;
  DdManager *dd_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  bCube = Cudd_ReadLogicZero(dd);
  Cudd_Ref(bCube);
  iVar2 = Abc_SopIsExorType(pSop);
  _Value = pSop;
  if (iVar2 == 0) {
    for (; *_Value != '\0'; _Value = _Value + (iVar1 + 3)) {
      bTemp = Cudd_ReadOne(dd);
      Cudd_Ref(bTemp);
      local_54 = 0;
      while( true ) {
        bVar4 = false;
        if (_Value[local_54] != ' ') {
          local_50 = (int)_Value[local_54];
          bVar4 = local_50 != 0;
        }
        if (!bVar4) break;
        if (local_50 == 0x30) {
          if (pbVars == (DdNode **)0x0) {
            local_80 = Cudd_bddIthVar(dd,local_54);
          }
          else {
            local_80 = pbVars[local_54];
          }
          pCube = (char *)((ulong)local_80 ^ 1);
LAB_00ad0298:
          pDVar3 = Cudd_bddAnd(dd,bTemp,(DdNode *)pCube);
          Cudd_Ref(pDVar3);
          Cudd_RecursiveDeref(dd,bTemp);
          bTemp = pDVar3;
        }
        else if (local_50 == 0x31) {
          if (pbVars == (DdNode **)0x0) {
            local_88 = Cudd_bddIthVar(dd,local_54);
          }
          else {
            local_88 = pbVars[local_54];
          }
          pCube = (char *)local_88;
          goto LAB_00ad0298;
        }
        local_54 = local_54 + 1;
      }
      pDVar3 = Cudd_bddOr(dd,bCube,bTemp);
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,bCube);
      Cudd_RecursiveDeref(dd,bTemp);
      bCube = pDVar3;
    }
  }
  else {
    for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
      if (pbVars == (DdNode **)0x0) {
        local_70 = Cudd_bddIthVar(dd,local_54);
      }
      else {
        local_70 = pbVars[local_54];
      }
      pDVar3 = Cudd_bddXor(dd,bCube,local_70);
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(dd,bCube);
      bCube = pDVar3;
    }
  }
  iVar1 = Abc_SopGetPhase(pSop);
  pDVar3 = (DdNode *)((ulong)bCube ^ (long)(int)(uint)((iVar1 != 0 ^ 0xffU) & 1));
  Cudd_Deref(pDVar3);
  return pDVar3;
}

Assistant:

DdNode * Abc_ConvertSopToBdd( DdManager * dd, char * pSop, DdNode ** pbVars )
{
    DdNode * bSum, * bCube, * bTemp, * bVar;
    char * pCube;
    int nVars, Value, v;

    // start the cover
    nVars = Abc_SopGetVarNum(pSop);
    bSum = Cudd_ReadLogicZero(dd);   Cudd_Ref( bSum );
    if ( Abc_SopIsExorType(pSop) )
    {
        for ( v = 0; v < nVars; v++ )
        {
            bSum  = Cudd_bddXor( dd, bTemp = bSum, pbVars? pbVars[v] : Cudd_bddIthVar(dd, v) );   Cudd_Ref( bSum );
            Cudd_RecursiveDeref( dd, bTemp );
        }
    }
    else
    {
        // check the logic function of the node
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            bCube = Cudd_ReadOne(dd);   Cudd_Ref( bCube );
            Abc_CubeForEachVar( pCube, Value, v )
            {
                if ( Value == '0' )
                    bVar = Cudd_Not( pbVars? pbVars[v] : Cudd_bddIthVar( dd, v ) );
                else if ( Value == '1' )
                    bVar = pbVars? pbVars[v] : Cudd_bddIthVar( dd, v );
                else
                    continue;
                bCube  = Cudd_bddAnd( dd, bTemp = bCube, bVar );   Cudd_Ref( bCube );
                Cudd_RecursiveDeref( dd, bTemp );
            }
            bSum = Cudd_bddOr( dd, bTemp = bSum, bCube );   
            Cudd_Ref( bSum );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
        }
    }
    // complement the result if necessary
    bSum = Cudd_NotCond( bSum, !Abc_SopGetPhase(pSop) );
    Cudd_Deref( bSum );
    return bSum;
}